

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime-c.cpp
# Opt level: O3

duckdb_time_struct duckdb_from_time(duckdb_time time)

{
  int32_t micros;
  int32_t second;
  int32_t minute;
  int32_t hour;
  int32_t local_30;
  uint local_2c;
  uint local_28;
  byte local_24 [4];
  
  duckdb::Time::Convert
            ((dtime_t)time.micros,(int32_t *)local_24,(int32_t *)&local_28,(int32_t *)&local_2c,
             &local_30);
  return (duckdb_time_struct)
         ((ulong)((local_28 & 0xff) << 8) | CONCAT44(local_30,(local_2c & 0xff) << 0x10) |
         (ulong)local_24[0]);
}

Assistant:

duckdb_time_struct duckdb_from_time(duckdb_time time) {
	int32_t hour, minute, second, micros;
	Time::Convert(dtime_t(time.micros), hour, minute, second, micros);

	duckdb_time_struct result;
	result.hour = duckdb::UnsafeNumericCast<int8_t>(hour);
	result.min = duckdb::UnsafeNumericCast<int8_t>(minute);
	result.sec = duckdb::UnsafeNumericCast<int8_t>(second);
	result.micros = micros;
	return result;
}